

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::ForStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  ulong uVar5;
  SQInteger SVar6;
  ulong pos;
  SQUnsignedInteger SVar7;
  long lVar8;
  SQFuncState *pSVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  SQInstructionVec exp;
  longlong local_50;
  SQScope __oldscope__;
  
  Lex(this);
  __oldscope__.outers = (this->_scope).outers;
  __oldscope__.stacksize = (this->_scope).stacksize;
  pSVar9 = this->_fs;
  (this->_scope).outers = pSVar9->_outers;
  SVar6 = SQFuncState::GetStackSize(pSVar9);
  (this->_scope).stacksize = SVar6;
  Expect(this,0x28);
  if (this->_token != 0x3b) {
    if (this->_token == 0x11b) {
      LocalDeclStatement(this);
    }
    else {
      CommaExpr(this);
      SQFuncState::PopTarget(this->_fs);
    }
  }
  Expect(this,0x3b);
  pSVar9 = this->_fs;
  pSVar9->_optimization = false;
  SVar2 = (pSVar9->_instructions)._size;
  if (this->_token == 0x3b) {
    pos = 0xffffffffffffffff;
  }
  else {
    CommaExpr(this);
    pSVar9 = this->_fs;
    SVar6 = SQFuncState::PopTarget(pSVar9);
    SQFuncState::AddInstruction(pSVar9,_OP_JZ,SVar6,0,0,0);
    pos = (this->_fs->_instructions)._size - 1;
  }
  Expect(this,0x3b);
  pSVar9 = this->_fs;
  pSVar9->_optimization = false;
  SVar3 = (pSVar9->_instructions)._size;
  if (this->_token != 0x29) {
    CommaExpr(this);
    SQFuncState::PopTarget(this->_fs);
  }
  Expect(this,0x29);
  pSVar9 = this->_fs;
  pSVar9->_optimization = false;
  SVar4 = (pSVar9->_instructions)._size;
  exp._allocated = 0;
  lVar8 = -(SVar3 - SVar4);
  lVar12 = SVar3 - SVar4;
  exp._vals = (SQInstruction *)0x0;
  exp._size = 0;
  if (lVar12 < 0) {
    lVar11 = SVar3 << 3;
    lVar10 = lVar8;
    while( true ) {
      bVar13 = lVar10 == 0;
      lVar10 = lVar10 + -1;
      if (bVar13) break;
      sqvector<SQInstruction>::push_back
                (&exp,(SQInstruction *)((long)&((this->_fs->_instructions)._vals)->_arg1 + lVar11));
      lVar11 = lVar11 + 8;
    }
    SQFuncState::PopInstructions(this->_fs,lVar8);
    pSVar9 = this->_fs;
  }
  SVar3 = (pSVar9->_unresolvedbreaks)._size;
  SVar4 = (pSVar9->_unresolvedcontinues)._size;
  local_50 = 0;
  sqvector<long_long>::push_back(&pSVar9->_breaktargets,&local_50);
  local_50 = 0;
  sqvector<long_long>::push_back(&this->_fs->_continuetargets,&local_50);
  Statement(this,true);
  pSVar9 = this->_fs;
  uVar5 = (pSVar9->_instructions)._size;
  SVar7 = uVar5;
  if (lVar12 < 0) {
    lVar12 = 0;
    while( true ) {
      pSVar9 = this->_fs;
      bVar13 = lVar8 == 0;
      lVar8 = lVar8 + -1;
      if (bVar13) break;
      SQFuncState::AddInstruction(pSVar9,(SQInstruction *)((long)&(exp._vals)->_arg1 + lVar12));
      lVar12 = lVar12 + 8;
    }
    SVar7 = (pSVar9->_instructions)._size;
  }
  SQFuncState::AddInstruction(pSVar9,_OP_JMP,0,SVar2 + ~SVar7,0,0);
  if (0 < (long)pos) {
    SQFuncState::SetIntructionParam(this->_fs,pos,1,~pos + (this->_fs->_instructions)._size);
  }
  lVar8 = this->_fs->_outers;
  SVar6 = SQFuncState::GetStackSize(this->_fs);
  pSVar9 = this->_fs;
  lVar12 = (this->_scope).stacksize;
  if (SVar6 != lVar12) {
    SQFuncState::SetStackSize(pSVar9,lVar12);
    pSVar9 = this->_fs;
    if (lVar8 != pSVar9->_outers) {
      SQFuncState::AddInstruction(pSVar9,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
      pSVar9 = this->_fs;
    }
  }
  (this->_scope).outers = __oldscope__.outers;
  (this->_scope).stacksize = __oldscope__.stacksize;
  SVar2 = (pSVar9->_unresolvedbreaks)._size;
  lVar8 = (pSVar9->_unresolvedcontinues)._size - SVar4;
  if (0 < lVar8) {
    ResolveContinues(this,pSVar9,lVar8,uVar5 - 1);
    pSVar9 = this->_fs;
  }
  lVar8 = SVar2 - SVar3;
  if (0 < lVar8) {
    ResolveBreaks(this,pSVar9,lVar8);
    pSVar9 = this->_fs;
  }
  pSVar1 = &(pSVar9->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar9->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  sqvector<SQInstruction>::~sqvector(&exp);
  return;
}

Assistant:

void ForStatement()
    {
        Lex();
        BEGIN_SCOPE();
        Expect(_SC('('));
        if(_token == TK_LOCAL) LocalDeclStatement();
        else if(_token != _SC(';')){
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger jmppos = _fs->GetCurrentPos();
        SQInteger jzpos = -1;
        if(_token != _SC(';')) { CommaExpr(); _fs->AddInstruction(_OP_JZ, _fs->PopTarget()); jzpos = _fs->GetCurrentPos(); }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger expstart = _fs->GetCurrentPos() + 1;
        if(_token != _SC(')')) {
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(')'));
        _fs->SnoozeOpt();
        SQInteger expend = _fs->GetCurrentPos();
        SQInteger expsize = (expend - expstart) + 1;
        SQInstructionVec exp;
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                exp.push_back(_fs->GetInstruction(expstart + i));
            _fs->PopInstructions(expsize);
        }
        BEGIN_BREAKBLE_BLOCK()
        Statement();
        SQInteger continuetrg = _fs->GetCurrentPos();
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                _fs->AddInstruction(exp[i]);
        }
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1, 0);
        if(jzpos>  0) _fs->SetIntructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);
        END_SCOPE();

        END_BREAKBLE_BLOCK(continuetrg);
    }